

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
ImageBox::writeXml_abi_cxx11_(string *__return_storage_ptr__,ImageBox *this,int indent)

{
  int indent_00;
  ostream *poVar1;
  int level;
  ImageScaleType scaleType;
  int level_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  stringstream str;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0 [32];
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(&local_270,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_1a0,(string *)&local_270);
  std::operator<<(poVar1,"<ImageBox");
  std::__cxx11::string::~string((string *)&local_270);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b0);
  std::__cxx11::string::string(local_1f0,"imageScaleType",(allocator *)&local_270);
  Util::toString_abi_cxx11_(&local_210,(Util *)(ulong)this->imageScaleType,scaleType);
  Util::writeXmlAttribute<std::__cxx11::string>
            (&local_1d0,(Util *)local_1b0,(stringstream *)local_1f0,&local_210,in_R8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string(local_1f0);
  poVar1 = std::operator<<(local_1a0,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  indent_00 = indent + 1;
  NinePatchMargin::writeXml_abi_cxx11_(&local_270,&this->ninePatchMargin,indent_00);
  std::operator<<(local_1a0,(string *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::string((string *)&local_230,"Image",(allocator *)&local_270);
  std::__cxx11::string::string((string *)&local_250,(string *)&this->image);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b0,indent_00,&local_230,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  Widget::writeXmlElements(&this->super_Widget,(stringstream *)local_1b0,indent_00);
  if ((this->super_Widget).numChildren < 1) {
    Util::getIndent_abi_cxx11_(&local_270,(Util *)(ulong)(uint)indent,level_00);
    poVar1 = std::operator<<(local_1a0,(string *)&local_270);
    std::operator<<(poVar1,"</ImageBox>");
    std::__cxx11::string::~string((string *)&local_270);
  }
  else {
    Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b0,indent);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageBox::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<ImageBox";
	writeXmlAttributes(str);
	Util::writeXmlAttribute(str, "imageScaleType", Util::toString(imageScaleType));
	str << ">" << std::endl;
	str << ninePatchMargin.writeXml(indent + 1);
	Util::writeXmlElement(str, indent + 1, "Image", image);

	Widget::writeXmlElements(str, indent + 1);

	if (numChildren <= 0)
	{
		str << Util::getIndent(indent) << "</ImageBox>";
		return str.str();
	}

	writeXmlChildren(str, indent);

	return str.str();
}